

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O0

void __thiscall
CVmObjTable::save_image_pointer(CVmObjTable *this,vm_obj_id_t obj_id,char *ptr,size_t siz)

{
  void *pvVar1;
  undefined8 in_RCX;
  undefined4 *puVar2;
  undefined8 in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  vm_image_ptr *slot;
  
  if (*(long *)(in_RDI + 0x38) == 0) {
    pvVar1 = malloc(0x2588);
    *(void **)(in_RDI + 0x38) = pvVar1;
    if (*(long *)(in_RDI + 0x38) == 0) {
      err_throw(0);
    }
    *(undefined8 *)(in_RDI + 0x40) = *(undefined8 *)(in_RDI + 0x38);
    **(undefined8 **)(in_RDI + 0x40) = 0;
    *(undefined8 *)(in_RDI + 0x48) = 0;
  }
  else if (*(long *)(in_RDI + 0x48) == 400) {
    pvVar1 = malloc(0x2588);
    **(undefined8 **)(in_RDI + 0x40) = pvVar1;
    if (**(long **)(in_RDI + 0x40) == 0) {
      err_throw(0);
    }
    *(undefined8 *)(in_RDI + 0x40) = **(undefined8 **)(in_RDI + 0x40);
    **(undefined8 **)(in_RDI + 0x40) = 0;
    *(undefined8 *)(in_RDI + 0x48) = 0;
  }
  puVar2 = (undefined4 *)(*(long *)(in_RDI + 0x40) + 8 + *(long *)(in_RDI + 0x48) * 0x18);
  *puVar2 = in_ESI;
  *(undefined8 *)(puVar2 + 2) = in_RDX;
  *(undefined8 *)(puVar2 + 4) = in_RCX;
  *(long *)(in_RDI + 0x48) = *(long *)(in_RDI + 0x48) + 1;
  return;
}

Assistant:

void CVmObjTable::save_image_pointer(vm_obj_id_t obj_id, const char *ptr,
                                     size_t siz)
{
    vm_image_ptr *slot;
    
    /* allocate a new page if we're out of slots on the current page */
    if (image_ptr_head_ == 0)
    {
        /* no pages yet - allocate the first page */
        image_ptr_head_ = (vm_image_ptr_page *)
                          t3malloc(sizeof(vm_image_ptr_page));
        if (image_ptr_head_ == 0)
            err_throw(VMERR_OUT_OF_MEMORY);

        /* it's also the last page */
        image_ptr_tail_ = image_ptr_head_;
        image_ptr_tail_->next_ = 0;

        /* no slots used on this page yet */
        image_ptr_last_cnt_ = 0;
    }
    else if (image_ptr_last_cnt_ == VM_IMAGE_PTRS_PER_PAGE)
    {
        /* the last page is full - allocate another one */
        image_ptr_tail_->next_ = (vm_image_ptr_page *)
                                 t3malloc(sizeof(vm_image_ptr_page));
        if (image_ptr_tail_->next_ == 0)
            err_throw(VMERR_OUT_OF_MEMORY);

        /* it's the new last page */
        image_ptr_tail_ = image_ptr_tail_->next_;
        image_ptr_tail_->next_ = 0;

        /* no slots used on this page yet */
        image_ptr_last_cnt_ = 0;
    }

    /* get the next available slot */
    slot = &image_ptr_tail_->ptrs_[image_ptr_last_cnt_];

    /* save the data */
    slot->obj_id_ = obj_id;
    slot->image_data_ptr_ = ptr;
    slot->image_data_len_ = siz;

    /* count the new record */
    ++image_ptr_last_cnt_;
}